

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.c
# Opt level: O0

char * getActionName(efsw_action action)

{
  char *pcStack_10;
  efsw_action action_local;
  
  switch(action) {
  case EFSW_ADD:
    pcStack_10 = "Add";
    break;
  case EFSW_DELETE:
    pcStack_10 = "Delete";
    break;
  case EFSW_MODIFIED:
    pcStack_10 = "Modified";
    break;
  case EFSW_MOVED:
    pcStack_10 = "Moved";
    break;
  default:
    pcStack_10 = "Bad Action";
  }
  return pcStack_10;
}

Assistant:

const char * getActionName( enum efsw_action action ) {
	switch ( action ) {
		case EFSW_ADD:
			return "Add";
		case EFSW_MODIFIED:
			return "Modified";
		case EFSW_DELETE:
			return "Delete";
		case EFSW_MOVED:
			return "Moved";
		default:
			return "Bad Action";
	}
}